

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void throwit(obj *obj,obj *ostack,long wep_mask,boolean twoweap,schar dx,schar dy,schar dz)

{
  long ostack_00;
  obj *obj_00;
  boolean bVar1;
  schar sVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  int local_10c;
  char *local_b8;
  monst *local_a0;
  bool local_91;
  int local_6c;
  bool local_61;
  bool local_41;
  int local_40;
  char local_3c;
  boolean local_3b;
  char local_3a;
  bool local_39;
  int dmg;
  boolean obj_gone;
  boolean obj_destroyed;
  boolean slipok;
  boolean impaired;
  int urange;
  int range;
  monst *mon;
  schar dy_local;
  schar dx_local;
  ulong uStack_20;
  boolean twoweap_local;
  long wep_mask_local;
  obj *ostack_local;
  obj *obj_local;
  
  local_41 = true;
  mon._5_1_ = dy;
  mon._6_1_ = dx;
  mon._7_1_ = twoweap;
  uStack_20 = wep_mask;
  wep_mask_local = (long)ostack;
  ostack_local = obj;
  if (((((u.uprops[0x1c].intrinsic == 0) && (local_41 = true, u.uprops[0x1b].intrinsic == 0)) &&
       (local_41 = true, u.umonnum != 0x9e)) && (local_41 = true, (youmonst.data)->mlet != '\x1c'))
     && ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((local_41 = true, ublindf != (obj *)0x0 && (local_41 = true, ublindf->oartifact == '\x1d')
          ))))) {
    if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_001acd2b:
      local_61 = u.uprops[0x25].intrinsic != 0 || u.uprops[0x25].extrinsic != 0;
      local_41 = local_61;
    }
    else {
      local_41 = true;
      if (u.umonnum != u.umonster) {
        bVar1 = dmgtype(youmonst.data,0x24);
        local_41 = true;
        if (bVar1 != '\0') goto LAB_001acd2b;
      }
    }
  }
  local_39 = local_41;
  *(uint *)&ostack_local->field_0x4a = *(uint *)&ostack_local->field_0x4a & 0xfdffffff | 0x2000000;
  if ((((((*(uint *)&ostack_local->field_0x4a & 1) != 0) && (iVar4 = rnf(1,7), iVar4 != 0)) ||
       (((*(uint *)&ostack_local->field_0x4a >> 0x14 & 1) != 0 && (iVar4 = rnf(1,7), iVar4 != 0))))
      || ((iVar4 = weapon_type(ostack_local), u.weapon_skills[iVar4].skill == '\0' &&
          (iVar4 = rnf(1,5), iVar4 != 0)))) && ((u.dx != '\0' || (u.dy != '\0')))) {
    local_3a = '\x01';
    if ((((ostack_local->oclass == '\x02') || (ostack_local->oclass == '\r')) &&
        (-0x19 < objects[ostack_local->otyp].oc_subtyp)) &&
       (((objects[ostack_local->otyp].oc_subtyp < -0x15 && (uwep != (obj *)0x0)) &&
        ((int)objects[ostack_local->otyp].oc_subtyp == -(int)objects[uwep->otyp].oc_subtyp)))) {
      pcVar5 = Tobjnam(ostack_local,"misfire");
      pline("%s!",pcVar5);
    }
    else if (((*(uint *)&ostack_local->field_0x4a >> 0x14 & 1) == 0) &&
            (bVar1 = throwing_weapon(ostack_local), bVar1 == '\0')) {
      local_3a = '\0';
    }
    else {
      pcVar5 = Tobjnam(ostack_local,"slip");
      pline("%s as you throw it!",pcVar5);
    }
    if (local_3a != '\0') {
      iVar4 = rn2(3);
      mon._6_1_ = (char)iVar4 + -1;
      iVar4 = rn2(3);
      mon._5_1_ = (char)iVar4 + -1;
      if ((mon._6_1_ == '\0') && (mon._5_1_ == '\0')) {
        iVar4 = rnf(1,3);
        dz = '\x01';
        if (iVar4 != 0) {
          dz = -1;
        }
      }
      local_39 = true;
    }
  }
  if ((((mon._6_1_ != '\0') || (mon._5_1_ != '\0')) || (dz < '\x01')) &&
     (iVar4 = calc_capacity(ostack_local->owt), 1 < iVar4)) {
    if (u.umonnum == u.umonster) {
      if ((u.uhp < 10) && (u.uhp != u.uhpmax)) goto LAB_001ad06b;
    }
    else if ((u.mh < 5) && (u.mh != u.mhmax)) {
LAB_001ad06b:
      if (u.umonnum == u.umonster) {
        local_6c = u.uhp;
      }
      else {
        local_6c = u.mh;
      }
      if (((uint)(local_6c * 2) < ostack_local->owt) &&
         (bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar1 == '\0')) {
        pcVar5 = xname(ostack_local);
        the(pcVar5);
        pline("You have so little stamina, %s drops from your grasp.");
        exercise(4,'\0');
        mon._5_1_ = '\0';
        mon._6_1_ = '\0';
        dz = '\x01';
      }
    }
  }
  thrownobj = ostack_local;
  if ((u._1052_1_ & 1) == 0) {
    if (dz != '\0') {
      if ((((dz < '\0') && (urole.malenum == 0x167)) && (ostack_local->oartifact == '\x05')) &&
         (local_39 == false)) {
        pcVar5 = Tobjnam(ostack_local,"hit");
        pcVar6 = ceiling((int)u.ux,(int)u.uy);
        pline("%s the %s and returns to your hand!",pcVar5,pcVar6);
        ostack_local = addinv(ostack_local);
        encumber_msg();
        setuwep(ostack_local);
        u.twoweap = mon._7_1_;
      }
      else if (((dz < '\0') &&
               (bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar1 == '\0')) &&
              ((((byte)u._1052_1_ >> 1 & 1) == 0 &&
               (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), obj_00 = ostack_local,
               ostack_00 = wep_mask_local, bVar1 == '\0')))) {
        iVar4 = rn2(5);
        toss_up(obj_00,(obj *)ostack_00,(boolean)iVar4);
      }
      else {
        hitfloor(ostack_local,(obj *)wep_mask_local,'\x01');
      }
      thrownobj = (obj *)0x0;
      return;
    }
    if ((ostack_local->otyp == 9) && (((byte)u._1052_1_ >> 1 & 1) == 0)) {
      bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if ((((bVar1 != '\0') || (u.uprops[0x12].intrinsic != 0)) || (u.uprops[0x12].extrinsic != 0))
         || ((youmonst.data)->mlet == '\x05')) {
        hurtle(-(int)mon._6_1_,-(int)mon._5_1_,1,'\x01');
      }
      _urange = boomhit((int)mon._6_1_,(int)mon._5_1_);
      if (_urange == &youmonst) {
        exercise(3,'\x01');
        ostack_local = addinv(ostack_local);
        encumber_msg();
        if ((uStack_20 != 0) && (((long)ostack_local->owornmask & uStack_20) == 0)) {
          setworn(ostack_local,uStack_20);
          u.twoweap = mon._7_1_;
        }
        thrownobj = (obj *)0x0;
        return;
      }
    }
    else {
      sVar2 = acurrstr();
      dmg = (int)sVar2 / 2;
      if (ostack_local->otyp == 0x216) {
        uVar8 = ostack_local->owt / 100;
      }
      else {
        uVar8 = ostack_local->owt / 0x28;
      }
      _obj_gone = dmg - uVar8;
      if (ostack_local == uball) {
        if (u.ustuck == (monst *)0x0) {
          if (4 < _obj_gone) {
            _obj_gone = 5;
          }
        }
        else {
          _obj_gone = 1;
        }
      }
      if (_obj_gone < 1) {
        _obj_gone = 1;
      }
      if ((((ostack_local->oclass == '\x02') || (ostack_local->oclass == '\r')) &&
          (-0x19 < objects[ostack_local->otyp].oc_subtyp)) &&
         (objects[ostack_local->otyp].oc_subtyp < -0x15)) {
        if ((((ostack_local->oclass == '\x02') || (ostack_local->oclass == '\r')) &&
            ((-0x19 < objects[ostack_local->otyp].oc_subtyp &&
             ((objects[ostack_local->otyp].oc_subtyp < -0x15 && (uwep != (obj *)0x0)))))) &&
           ((int)objects[ostack_local->otyp].oc_subtyp == -(int)objects[uwep->otyp].oc_subtyp)) {
          _obj_gone = _obj_gone + 1;
        }
        else if (ostack_local->oclass != '\r') {
          _obj_gone = _obj_gone / 2;
        }
      }
      bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if ((((bVar1 != '\0') || (u.uprops[0x12].intrinsic != 0)) || (u.uprops[0x12].extrinsic != 0))
         || ((youmonst.data)->mlet == '\x05')) {
        dmg = dmg - _obj_gone;
        if (dmg < 1) {
          dmg = 1;
        }
        _obj_gone = _obj_gone - dmg;
        if (_obj_gone < 1) {
          _obj_gone = 1;
        }
      }
      if (ostack_local->otyp == 0x214) {
        _obj_gone = 0x14;
      }
      else if (ostack_local->oartifact == '\x05') {
        _obj_gone = (_obj_gone + 1) / 2;
      }
      else if (((ostack_local == uball) && (u.utrap != 0)) && (u.utraptype == 4)) {
        _obj_gone = 1;
      }
      if (((byte)u._1052_1_ >> 1 & 1) != 0) {
        _obj_gone = 1;
      }
      local_3b = '\0';
      _urange = beam_hit((int)mon._6_1_,(int)mon._5_1_,_obj_gone,1,
                         (_func_int_monst_ptr_obj_ptr *)0x0,(_func_int_obj_ptr_obj_ptr *)0x0,
                         ostack_local,&local_3b);
      bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar1 != '\0') || (u.uprops[0x12].intrinsic != 0)) ||
         ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))) {
        hurtle(-(int)mon._6_1_,-(int)mon._5_1_,dmg,'\x01');
      }
      if (local_3b != '\0') {
        return;
      }
    }
  }
  else {
    _urange = u.ustuck;
    bhitpos.x = (u.ustuck)->mx;
    bhitpos.y = (u.ustuck)->my;
  }
  if (_urange == (monst *)0x0) goto LAB_001ada17;
  if ((((*(uint *)&_urange->field_0x60 >> 0x19 & 1) != 0) && (ostack_local->where == '\x04')) &&
     ((monst *)(ostack_local->v).v_nexthere == _urange)) {
    thrownobj = (obj *)0x0;
    return;
  }
  snuff_candle(ostack_local);
  local_91 = true;
  if (bhitpos.x == _urange->mx) {
    local_91 = bhitpos.y != _urange->my;
  }
  notonhead = local_91;
  iVar4 = thitmonst(_urange,ostack_local,(obj *)wep_mask_local);
  local_3c = (char)iVar4;
  if ((level->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
    local_a0 = (monst *)0x0;
  }
  else {
    local_a0 = level->monsters[bhitpos.x][bhitpos.y];
  }
  _urange = local_a0;
  if ((local_a0 != (monst *)0x0) && ((*(uint *)&local_a0->field_0x60 >> 0x19 & 1) != 0)) {
    cVar3 = inside_shop(level,u.ux,u.uy);
    if (cVar3 != '\0') {
      pcVar5 = in_rooms(level,_urange->mx,_urange->my,0x12);
      pcVar5 = strchr(pcVar5,(int)u.ushops[0]);
      if (pcVar5 != (char *)0x0) goto LAB_001ada0a;
    }
    hot_pursuit(_urange);
  }
LAB_001ada0a:
  if (local_3c != '\0') {
    return;
  }
LAB_001ada17:
  if ((u._1052_1_ & 1) == 0) {
    if (((ostack_local->oartifact == '\x05') && (urole.malenum == 0x167)) &&
       (iVar4 = rn2(100), iVar4 != 0)) {
      sho_obj_return_to_u(ostack_local,mon._6_1_,mon._5_1_);
      if ((local_39 == false) && (iVar4 = rn2(100), iVar4 != 0)) {
        pcVar5 = Tobjnam(ostack_local,"return");
        pline("%s to your hand!",pcVar5);
        ostack_local = addinv(ostack_local);
        encumber_msg();
        setuwep(ostack_local);
        u.twoweap = mon._7_1_;
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
          newsym((int)bhitpos.x,(int)bhitpos.y);
        }
      }
      else {
        local_40 = rn2(2);
        if (local_40 == 0) {
          if (((u.uprops[0x1e].intrinsic != 0) ||
              ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
             (bVar9 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
            bVar9 = false;
            if (ublindf != (obj *)0x0) {
              bVar9 = ublindf->oartifact == '\x1d';
            }
            bVar9 = (bool)(bVar9 ^ 1);
          }
          pcVar5 = "%s back to you, landing %s your %s.";
          if (bVar9) {
            pcVar5 = "%s lands %s your %s.";
          }
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            local_b8 = Tobjnam(ostack_local,"return");
          }
          else {
            local_b8 = "Something";
          }
          bVar9 = true;
          if ((u.uprops[0x12].intrinsic == 0) && (bVar9 = true, u.uprops[0x12].extrinsic == 0)) {
            bVar9 = (youmonst.data)->mlet == '\x05';
          }
          pcVar6 = "at";
          if (bVar9) {
            pcVar6 = "beneath";
          }
          pcVar7 = body_part(5);
          makeplural(pcVar7);
          pline(pcVar5,local_b8,pcVar6);
        }
        else {
          iVar4 = rnd(3);
          local_40 = iVar4 + local_40;
          if ((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (bVar9 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
            bVar9 = false;
            if (ublindf != (obj *)0x0) {
              bVar9 = ublindf->oartifact == '\x1d';
            }
            bVar9 = (bool)(bVar9 ^ 1);
          }
          pcVar5 = "%s back toward you, hitting your %s!";
          if (bVar9) {
            pcVar5 = "%s your %s!";
          }
          if (((u.uprops[0x1e].intrinsic != 0) ||
              ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
             (bVar9 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
            bVar9 = false;
            if (ublindf != (obj *)0x0) {
              bVar9 = ublindf->oartifact == '\x1d';
            }
            bVar9 = (bool)(bVar9 ^ 1);
          }
          pcVar6 = "fly";
          if (bVar9) {
            pcVar6 = "hit";
          }
          pcVar6 = Tobjnam(ostack_local,pcVar6);
          pcVar7 = body_part(0);
          pline(pcVar5,pcVar6,pcVar7);
          artifact_hit((monst *)0x0,&youmonst,ostack_local,(obj *)wep_mask_local,'\x01',&local_40,0)
          ;
          iVar4 = local_40;
          pcVar5 = xname(ostack_local);
          bVar1 = obj_is_pname(ostack_local);
          losehp(iVar4,pcVar5,(uint)(bVar1 != '\0'));
        }
        bVar1 = ship_object(ostack_local,u.ux,u.uy,'\0');
        if (bVar1 != '\0') {
          thrownobj = (obj *)0x0;
          return;
        }
        dropy(ostack_local);
      }
      thrownobj = (obj *)0x0;
    }
    else if ((((level->locations[bhitpos.x][bhitpos.y].typ == '%') ||
              (level->locations[bhitpos.x][bhitpos.y].typ == '&')) ||
             (('\x10' < level->locations[bhitpos.x][bhitpos.y].typ &&
              (level->locations[bhitpos.x][bhitpos.y].typ < '\x15')))) ||
            ((level->locations[bhitpos.x][bhitpos.y].typ == '#' ||
             (bVar1 = breaktest(ostack_local), bVar1 == '\0')))) {
      bVar1 = flooreffects(ostack_local,(int)bhitpos.x,(int)bhitpos.y,"fall");
      if (bVar1 == '\0') {
        obj_no_longer_held(ostack_local);
        bVar1 = detonate_obj(ostack_local,(obj *)wep_mask_local,uwep,(int)bhitpos.x,(int)bhitpos.y,
                             '\x01');
        if (bVar1 == '\0') {
          if ((((_urange == (monst *)0x0) || ((*(uint *)&_urange->field_0x60 >> 0x19 & 1) == 0)) ||
              ((ostack_local->oclass != '\x02' && (ostack_local->oclass != '\x06')))) ||
             (objects[ostack_local->otyp].oc_subtyp != '\x04')) {
            snuff_candle(ostack_local);
            if ((_urange == (monst *)0x0) &&
               (bVar1 = ship_object(ostack_local,bhitpos.x,bhitpos.y,'\0'), bVar1 != '\0')) {
              thrownobj = (obj *)0x0;
            }
            else {
              thrownobj = (obj *)0x0;
              place_object(ostack_local,level,(int)bhitpos.x,(int)bhitpos.y);
              if ((u.ushops[0] != '\0') && (ostack_local != uball)) {
                check_shop_obj(ostack_local,bhitpos.x,bhitpos.y,'\0');
              }
              stackobj(ostack_local);
              if (ostack_local == uball) {
                drop_ball(bhitpos.x,bhitpos.y,mon._6_1_,mon._5_1_);
              }
              if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
                newsym((int)bhitpos.x,(int)bhitpos.y);
              }
              bVar1 = obj_sheds_light(ostack_local);
              if (bVar1 != '\0') {
                vision_full_recalc = '\x01';
              }
              *(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 =
                   *(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0xfffffffb;
              if ((((level->locations[bhitpos.x][bhitpos.y].typ != '%') &&
                   (level->locations[bhitpos.x][bhitpos.y].typ != '&')) &&
                  ((level->locations[bhitpos.x][bhitpos.y].typ < '\x11' ||
                   ('\x14' < level->locations[bhitpos.x][bhitpos.y].typ)))) &&
                 (level->locations[bhitpos.x][bhitpos.y].typ != '#')) {
                container_impact_dmg(ostack_local);
              }
            }
          }
          else {
            if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
              pcVar5 = Monnam(_urange);
              pcVar6 = xname(ostack_local);
              pcVar6 = the(pcVar6);
              pline("%s snatches up %s.",pcVar5,pcVar6);
            }
            if (u.ushops[0] != '\0') {
              check_shop_obj(ostack_local,bhitpos.x,bhitpos.y,'\0');
            }
            mpickobj(_urange,ostack_local);
            thrownobj = (obj *)0x0;
          }
        }
      }
    }
    else {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
        local_10c = (int)ostack_local->otyp;
      }
      else {
        local_10c = display_rng(0x219);
        local_10c = local_10c + 1;
      }
      tmp_at(-4,local_10c + 1);
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      tmp_at(-6,0);
      breakmsg(ostack_local,viz_array[bhitpos.y][bhitpos.x] & 2);
      breakobj(ostack_local,bhitpos.x,bhitpos.y,'\x01','\x01');
    }
  }
  else if (ostack_local != uball) {
    mpickobj(u.ustuck,ostack_local);
  }
  return;
}

Assistant:

void throwit(struct obj *obj,
	     struct obj *ostack,
	     long wep_mask,  /* used to re-equip returning boomerang */
	     boolean twoweap, /* used to restore twoweapon mode if wielded weapon returns */
	     schar dx, schar dy, schar dz)
{
	struct monst *mon;
	int range, urange;
	boolean impaired = (Confusion || Stunned || Blind ||
			   Hallucination || Fumbling);

	obj->was_thrown = 1;
	/* Split slip chance of cursed and greased objects; one that is both
	 * has a 1-(6/7)^2 (or 13/49, or ~26%) chance of slipping.
	 * Also, restricted throwing has a 20% chance of slipping
	 * to discourage role-/race-atypical fighting.
	 */
	if (((obj->cursed && rnf(1,7)) ||
	     (obj->greased && rnf(1,7)) ||
	     (P_SKILL(weapon_type(obj)) == P_ISRESTRICTED && rnf(1,5))) &&
	    (u.dx || u.dy)) {
	    boolean slipok = TRUE;
	    if (ammo_and_launcher(obj, uwep))
		pline("%s!", Tobjnam(obj, "misfire"));
	    else {
		/* only slip if it's greased or meant to be thrown */
		if (obj->greased || throwing_weapon(obj))
		    /* BUG: this message is grammatically incorrect if obj has
		       a plural name; greased gloves or boots for instance. */
		    pline("%s as you throw it!", Tobjnam(obj, "slip"));
		else slipok = FALSE;
	    }
	    if (slipok) {
		dx = rn2(3)-1;
		dy = rn2(3)-1;
		if (!dx && !dy)
		    dz = rnf(1,3) ? -1 : 1;
		impaired = TRUE;
	    }
	}

	if ((dx || dy || (dz < 1)) &&
	    calc_capacity((int)obj->owt) > SLT_ENCUMBER &&
	    (Upolyd ? (u.mh < 5 && u.mh != u.mhmax)
	     : (u.uhp < 10 && u.uhp != u.uhpmax)) &&
	    obj->owt > (unsigned)((Upolyd ? u.mh : u.uhp) * 2) &&
	    !Is_airlevel(&u.uz)) {
	    pline("You have so little stamina, %s drops from your grasp.",
		the(xname(obj)));
	    exercise(A_CON, FALSE);
	    dx = dy = 0;
	    dz = 1;
	}

	thrownobj = obj;

	if (u.uswallow) {
		mon = u.ustuck;
		bhitpos.x = mon->mx;
		bhitpos.y = mon->my;
	} else if (dz) {
	    if (dz < 0 && Role_if (PM_VALKYRIE) &&
		    obj->oartifact == ART_MJOLLNIR && !impaired) {
		pline("%s the %s and returns to your hand!",
		      Tobjnam(obj, "hit"), ceiling(u.ux,u.uy));
		obj = addinv(obj);
		encumber_msg();
		setuwep(obj);
		u.twoweap = twoweap;
	    } else if (dz < 0 && !Is_airlevel(&u.uz) &&
		    !Underwater && !Is_waterlevel(&u.uz)) {
		toss_up(obj, ostack, rn2(5));
	    } else {
		hitfloor(obj, ostack, TRUE);
	    }
	    thrownobj = NULL;
	    return;

	} else if (obj->otyp == BOOMERANG && !Underwater) {
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, 1, TRUE);
		mon = boomhit(dx, dy);
		if (mon == &youmonst) {		/* the thing was caught */
			exercise(A_DEX, TRUE);
			obj = addinv(obj);
			encumber_msg();
			if (wep_mask && !(obj->owornmask & wep_mask)) {
			    setworn(obj, wep_mask);
			    u.twoweap = twoweap;
			}
			thrownobj = NULL;
			return;
		}
	} else {
		boolean obj_destroyed;
		urange = (int)(ACURRSTR)/2;
		/* balls are easy to throw or at least roll */
		/* also, this insures the maximum range of a ball is greater
		 * than 1, so the effects from throwing attached balls are
		 * actually possible
		 */
		if (obj->otyp == HEAVY_IRON_BALL)
			range = urange - (int)(obj->owt/100);
		else
			range = urange - (int)(obj->owt/40);
		if (obj == uball) {
			if (u.ustuck) range = 1;
			else if (range >= 5) range = 5;
		}
		if (range < 1) range = 1;

		if (is_ammo(obj)) {
		    if (ammo_and_launcher(obj, uwep))
			range++;
		    else if (obj->oclass != GEM_CLASS)
			range /= 2;
		}

		if (Is_airlevel(&u.uz) || Levitation) {
		    /* action, reaction... */
		    urange -= range;
		    if (urange < 1) urange = 1;
		    range -= urange;
		    if (range < 1) range = 1;
		}

		if (obj->otyp == BOULDER)
		    range = 20;		/* you must be giant */
		else if (obj->oartifact == ART_MJOLLNIR)
		    range = (range + 1) / 2;	/* it's heavy */
		else if (obj == uball && u.utrap && u.utraptype == TT_INFLOOR)
		    range = 1;

		if (Underwater) range = 1;
		
		obj_destroyed = FALSE;
		mon = beam_hit(dx, dy, range, THROWN_WEAPON, NULL, NULL, obj,
			       &obj_destroyed);

		/* have to do this after bhit() so u.ux & u.uy are correct */
		if (Is_airlevel(&u.uz) || Levitation)
		    hurtle(-dx, -dy, urange, TRUE);
		
		if (obj_destroyed) return;
	}

	if (mon) {
		boolean obj_gone;

		if (mon->isshk &&
		    obj->where == OBJ_MINVENT && obj->ocarry == mon) {
		    thrownobj = NULL;
		    return;		/* alert shk caught it */
		}
		snuff_candle(obj);
		notonhead = (bhitpos.x != mon->mx || bhitpos.y != mon->my);
		obj_gone = thitmonst(mon, obj, ostack);
		/* Monster may have been tamed; this frees old mon */
		mon = m_at(level, bhitpos.x, bhitpos.y);

		/* [perhaps this should be moved into thitmonst or hmon] */
		if (mon && mon->isshk &&
			(!inside_shop(level, u.ux, u.uy) ||
			 !strchr(in_rooms(level, mon->mx, mon->my, SHOPBASE), *u.ushops)))
		    hot_pursuit(mon);

		if (obj_gone) return;
	}

	if (u.uswallow) {
		/* ball is not picked up by monster */
		if (obj != uball) mpickobj(u.ustuck,obj);
	} else {
		/* the code following might become part of dropy() */
		if (obj->oartifact == ART_MJOLLNIR &&
			Role_if (PM_VALKYRIE) && rn2(100)) {
		    /* we must be wearing Gauntlets of Power to get here */
		    sho_obj_return_to_u(obj, dx, dy);	    /* display its flight */

		    if (!impaired && rn2(100)) {
			pline("%s to your hand!", Tobjnam(obj, "return"));
			obj = addinv(obj);
			encumber_msg();
			setuwep(obj);
			u.twoweap = twoweap;
			if (cansee(bhitpos.x, bhitpos.y))
			    newsym(bhitpos.x,bhitpos.y);
		    } else {
			int dmg = rn2(2);
			if (!dmg) {
			    pline(Blind ? "%s lands %s your %s." :
					"%s back to you, landing %s your %s.",
				  Blind ? "Something" : Tobjnam(obj, "return"),
				  Levitation ? "beneath" : "at",
				  makeplural(body_part(FOOT)));
			} else {
			    dmg += rnd(3);
			    pline(Blind ? "%s your %s!" :
					"%s back toward you, hitting your %s!",
				  Tobjnam(obj, Blind ? "hit" : "fly"),
				  body_part(ARM));
			    artifact_hit(NULL, &youmonst, obj, ostack, TRUE,
					 &dmg, 0);
			    losehp(dmg, xname(obj),
				obj_is_pname(obj) ? KILLED_BY : KILLED_BY_AN);
			}
			if (ship_object(obj, u.ux, u.uy, FALSE)) {
		    	    thrownobj = NULL;
			    return;
			}
			dropy(obj);
		    }
		    thrownobj = NULL;
		    return;
		}

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ) &&
			breaktest(obj)) {
		    tmp_at(DISP_OBJECT, dbuf_objid(obj));
		    tmp_at(bhitpos.x, bhitpos.y);
		    win_delay_output();
		    tmp_at(DISP_END, 0);
		    breakmsg(obj, cansee(bhitpos.x, bhitpos.y));
		    breakobj(obj, bhitpos.x, bhitpos.y, TRUE, TRUE);
		    return;
		}
		if (flooreffects(obj,bhitpos.x,bhitpos.y,"fall")) return;
		obj_no_longer_held(obj);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return;
		if (mon && mon->isshk && is_pick(obj)) {
		    if (cansee(bhitpos.x, bhitpos.y))
			pline("%s snatches up %s.",
			      Monnam(mon), the(xname(obj)));
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);
		    mpickobj(mon, obj);	/* may merge and free obj */
		    thrownobj = NULL;
		    return;
		}
		snuff_candle(obj);
		if (!mon && ship_object(obj, bhitpos.x, bhitpos.y, FALSE)) {
		    thrownobj = NULL;
		    return;
		}
		thrownobj = NULL;
		place_object(obj, level, bhitpos.x, bhitpos.y);
		if (*u.ushops && obj != uball)
		    check_shop_obj(obj, bhitpos.x, bhitpos.y, FALSE);

		stackobj(obj);
		if (obj == uball)
		    drop_ball(bhitpos.x, bhitpos.y, dx, dy);
		if (cansee(bhitpos.x, bhitpos.y))
		    newsym(bhitpos.x,bhitpos.y);
		if (obj_sheds_light(obj))
		    vision_full_recalc = 1;

		/* Lead autoexplore back over thrown object if it's seen again.
		 * Technically the player may not see where it lands, but they
		 * could probably guess it anyway. */
		level->locations[bhitpos.x][bhitpos.y].mem_stepped = 0;

		if (!IS_SOFT(level->locations[bhitpos.x][bhitpos.y].typ))
		    container_impact_dmg(obj);
	}
}